

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwLogFile(char *name)

{
  FILE *pFVar1;
  FILE *pFVar2;
  time_t local_18;
  time_t tid;
  char *name_local;
  
  tid = (time_t)name;
  time(&local_18);
  pFVar1 = mwLogR();
  if (pFVar1 != (FILE *)0x0) {
    pFVar2 = (FILE *)mwLogR();
    fclose(pFVar2);
    mwLogW((FILE *)0x0);
  }
  if (tid != 0) {
    pFVar2 = fopen((char *)tid,"a");
    mwLogW((FILE *)pFVar2);
    pFVar1 = mwLogR();
    if (pFVar1 == (FILE *)0x0) {
      mwWrite("logfile: failed to open/create file \'%s\'\n",tid);
    }
  }
  return;
}

Assistant:

static void mwLogFile(const char *name)
{
	time_t tid;
	(void) time(&tid);
	if (mwLogR() != NULL) {
		fclose(mwLogR());
		mwLogW(NULL);
	}
	if (name == NULL) {
		return;
	}
	mwLogW(fopen(name, "a" COMMIT));
	if (mwLogR() == NULL) {
		mwWrite("logfile: failed to open/create file '%s'\n", name);
	}
}